

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_channel.cpp
# Opt level: O2

int __thiscall BmsChannel::GetChannelType(BmsChannel *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = BmsWord::ToInteger(&this->channel_number_);
  iVar2 = iVar1;
  switch(iVar1) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
    break;
  case 0xb:
    iVar2 = 0x3ea;
    break;
  case 0xc:
    iVar2 = 0x3eb;
    break;
  case 0xd:
    iVar2 = 0x3ec;
    break;
  case 0xe:
    iVar2 = 0x3ed;
    break;
  default:
    switch(iVar1) {
    case 0x169:
      iVar2 = 0x3ee;
      break;
    case 0x16a:
      iVar2 = 0x3ef;
      break;
    case 0x16b:
      iVar2 = 0x3f0;
      break;
    case 0x16c:
      iVar2 = 0x3f1;
      break;
    case 0x16d:
      iVar2 = 0x3e9;
      break;
    default:
      if (iVar1 - 0x25U < 0x23) {
        iVar2 = 0xb;
      }
      else if (iVar1 - 0x49U < 0x23) {
        iVar2 = 0x15;
      }
      else if (iVar1 - 0x6dU < 0x23) {
        iVar2 = 0x1f;
      }
      else if (iVar1 - 0x91U < 0x23) {
        iVar2 = 0x29;
      }
      else if (iVar1 - 0xb5U < 0x23) {
        iVar2 = 0x33;
      }
      else if (iVar1 - 0xd9U < 0x23) {
        iVar2 = 0x3d;
      }
      else {
        iVar2 = 0x83;
        if ((0x22 < iVar1 - 0x1d5U) && (iVar2 = 0x8d, 0x22 < iVar1 - 0x1f9U)) {
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int BmsChannel::GetChannelType() const {
	int c = channel_number_.ToInteger();
	if (c == 1)
		return BmsChannelType::BGM;
	else if (c == 2)
		return BmsChannelType::MEASURELENGTH;
	else if (c == 3)
		return BmsChannelType::BPM;
	else if (c == 4)
		return BmsChannelType::BGA;
	else if (c == 5)
		return BmsChannelType::EXTOBJ;
	else if (c == 6)
		return BmsChannelType::BGAPOOR;
	else if (c == 7)
		return BmsChannelType::BGALAYER;
	else if (c == 8)
		return BmsChannelType::EXTBPM;
	else if (c == 9)
		return BmsChannelType::STOP;
	else if (c == 10)
		return BmsChannelType::BGALAYER2;
	else if (c == 11)
		return BmsChannelType::BGAOPAC;
	else if (c == 12)
		return BmsChannelType::BGALAYEROPAC;
	else if (c == 13)
		return BmsChannelType::BGALAYER2OPAC;
	else if (c == 14)
		return BmsChannelType::BGAPOOROPAC;
	else if (c == 365)
		return BmsChannelType::BGAKEYBOUND;
	else if (c == 361)
		return BmsChannelType::BGAARGB;
	else if (c == 362)
		return BmsChannelType::BGALAYERARGB;
	else if (c == 363)
		return BmsChannelType::BGALAYER2ARGB;
	else if (c == 364)
		return BmsChannelType::BGAPOORARGB;
	else if (37 <= c && c < 72)
		return BmsChannelType::FIRSTPLAYER;
	else if (73 <= c && c < 108)
		return BmsChannelType::SECONDPLAYER;
	else if (109 <= c && c < 144)
		return BmsChannelType::FIRSTPLAYERHIDDEN;
	else if (145 <= c && c < 180)
		return BmsChannelType::SECONDPLAYERHIDDEN;
	else if (181 <= c && c < 216)
		return BmsChannelType::FIRSTPLAYERLN;
	else if (217 <= c && c < 252)
		return BmsChannelType::SECONDPLAYERLN;
	else if (469 <= c && c < 504)
		return BmsChannelType::FIRSTPLAYERMINE;
	else if (505 <= c && c < 540)
		return BmsChannelType::SECONDPLAYERMINE;
	return 0;	// unknown
}